

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

void __thiscall
QPDFCryptoProvider::setDefaultProvider_internal(QPDFCryptoProvider *this,string *name)

{
  key_type *pkVar1;
  element_type *peVar2;
  size_type sVar3;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  key_type *local_18;
  string *name_local;
  QPDFCryptoProvider *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  peVar2 = std::
           __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
          ::count(&peVar2->providers,local_18);
  pkVar1 = local_18;
  if (sVar3 == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,
                   "QPDFCryptoProvider: request to set default provider to unknown implementation \""
                   ,local_18);
    std::operator+(&local_38,&local_58,"\"");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar2 = std::
           __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::__cxx11::string::operator=((string *)peVar2,(string *)pkVar1);
  return;
}

Assistant:

void
QPDFCryptoProvider::setDefaultProvider_internal(std::string const& name)
{
    if (!m->providers.count(name)) {
        throw std::logic_error(
            "QPDFCryptoProvider: request to set default provider to unknown implementation \"" +
            name + "\"");
    }
    m->default_provider = name;
}